

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O2

PropertySymOpnd * __thiscall Inline::GetMethodLdOpndForCallInstr(Inline *this,Instr *callInstr)

{
  Opnd *this_00;
  bool bVar1;
  RegOpnd *pRVar2;
  StackSym *pSVar3;
  SymOpnd *pSVar4;
  PropertySymOpnd *pPVar5;
  Instr *pIVar6;
  
  this_00 = callInstr->m_src1;
  bVar1 = IR::Opnd::IsRegOpnd(this_00);
  if (bVar1) {
    pRVar2 = IR::Opnd::AsRegOpnd(this_00);
    if ((pRVar2->m_sym->super_Sym).m_kind == SymKindStack) {
      pRVar2 = IR::Opnd::AsRegOpnd(this_00);
      pSVar3 = Sym::AsStackSym(&pRVar2->m_sym->super_Sym);
      if (((pSVar3->field_0x18 & 1) != 0) && ((pSVar3->field_5).m_instrDef != (Instr *)0x0)) {
        pRVar2 = IR::Opnd::AsRegOpnd(this_00);
        pSVar3 = Sym::AsStackSym(&pRVar2->m_sym->super_Sym);
        if ((pSVar3->field_0x18 & 1) == 0) {
          pIVar6 = (Instr *)0x0;
        }
        else {
          pIVar6 = (pSVar3->field_5).m_instrDef;
        }
        if (pIVar6->m_src1 != (Opnd *)0x0) {
          bVar1 = IR::Opnd::IsSymOpnd(pIVar6->m_src1);
          if (bVar1) {
            pSVar4 = IR::Opnd::AsSymOpnd(pIVar6->m_src1);
            bVar1 = IR::SymOpnd::IsPropertySymOpnd(pSVar4);
            if (bVar1) {
              pSVar4 = IR::Opnd::AsSymOpnd(pIVar6->m_src1);
              pPVar5 = IR::Opnd::AsPropertySymOpnd(&pSVar4->super_Opnd);
              return pPVar5;
            }
          }
        }
      }
    }
  }
  return (PropertySymOpnd *)0x0;
}

Assistant:

IR::PropertySymOpnd*
Inline::GetMethodLdOpndForCallInstr(IR::Instr* callInstr)
{
    IR::Opnd* methodOpnd = callInstr->GetSrc1();
    if (methodOpnd->IsRegOpnd())
    {
        if (methodOpnd->AsRegOpnd()->m_sym->IsStackSym())
        {
            if (methodOpnd->AsRegOpnd()->m_sym->AsStackSym()->IsSingleDef())
            {
                IR::Instr* defInstr = methodOpnd->AsRegOpnd()->m_sym->AsStackSym()->GetInstrDef();
                if (defInstr->GetSrc1() && defInstr->GetSrc1()->IsSymOpnd() && defInstr->GetSrc1()->AsSymOpnd()->IsPropertySymOpnd())
                {
                    return defInstr->GetSrc1()->AsSymOpnd()->AsPropertySymOpnd();
                }
                return nullptr;
            }
            return nullptr;
        }
        return nullptr;
    }
    return nullptr;
}